

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManOrigIdsRemapPairsInsert(Vec_Int_t *vMap,int One,int Two)

{
  int iVar1;
  int Entry;
  int i;
  
  while( true ) {
    Entry = Two;
    if (One < Two) {
      Entry = One;
    }
    i = Two;
    if (Two < One) {
      i = One;
    }
    if (One == Two) break;
    iVar1 = Vec_IntEntry(vMap,i);
    if (iVar1 == -1) {
      Vec_IntWriteEntry(vMap,i,Entry);
      return;
    }
    Two = Vec_IntEntry(vMap,i);
    One = Entry;
  }
  __assert_fail("Smo != Big",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x4b,"void Gia_ManOrigIdsRemapPairsInsert(Vec_Int_t *, int, int)");
}

Assistant:

void Gia_ManOrigIdsRemapPairsInsert( Vec_Int_t * vMap, int One, int Two )
{
    int Smo = One < Two ? One : Two;
    int Big = One < Two ? Two : One;
    assert( Smo != Big );
    if ( Vec_IntEntry(vMap, Big) == -1 )
        Vec_IntWriteEntry( vMap, Big, Smo );
    else
        Gia_ManOrigIdsRemapPairsInsert( vMap, Smo, Vec_IntEntry(vMap, Big) );
}